

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_messagebox.cpp
# Opt level: O3

void QtMWidgets::MessageBox::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  TextFormat *pTVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  undefined8 uVar4;
  TextFormat TVar5;
  QString local_38;
  undefined8 local_18;
  
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 1) {
      _q_clicked((MessageBox *)_o);
      return;
    }
    if (_id == 0) {
      local_18 = *_a[1];
      local_38.d.ptr = (char16_t *)&local_18;
      local_38.d.d = (Data *)0x0;
      QMetaObject::activate(_o,&staticMetaObject,0,(void **)&local_38);
    }
    break;
  case ReadProperty:
    pTVar1 = (TextFormat *)*_a;
    if (_id == 1) {
      TVar5 = textFormat((MessageBox *)_o);
      *pTVar1 = TVar5;
    }
    else if (_id == 0) {
      text(&local_38,(MessageBox *)_o);
      pQVar2 = *(QArrayData **)pTVar1;
      *(Data **)pTVar1 = local_38.d.d;
      pcVar3 = *(char16_t **)(pTVar1 + 2);
      *(char16_t **)(pTVar1 + 2) = local_38.d.ptr;
      uVar4 = *(undefined8 *)(pTVar1 + 4);
      *(qsizetype *)(pTVar1 + 4) = local_38.d.size;
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          local_38.d.d = (Data *)pQVar2;
          local_38.d.ptr = pcVar3;
          local_38.d.size = uVar4;
          QArrayData::deallocate(pQVar2,2,8);
        }
      }
    }
    break;
  case WriteProperty:
    if (_id == 1) {
      setTextFormat((MessageBox *)_o,*(TextFormat *)&(((QString *)*_a)->d).d);
      return;
    }
    if (_id == 0) {
      setText((MessageBox *)_o,(QString *)*_a);
      return;
    }
    break;
  case IndexOfMethod:
    if ((*_a[1] == buttonClicked) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
  }
  return;
}

Assistant:

void QtMWidgets::MessageBox::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<MessageBox *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->buttonClicked((*reinterpret_cast< std::add_pointer_t<QAbstractButton*>>(_a[1]))); break;
        case 1: _t->_q_clicked(); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (MessageBox::*)(QAbstractButton * );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&MessageBox::buttonClicked)) {
                *result = 0;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<MessageBox *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< QString*>(_v) = _t->text(); break;
        case 1: *reinterpret_cast< Qt::TextFormat*>(_v) = _t->textFormat(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<MessageBox *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setText(*reinterpret_cast< QString*>(_v)); break;
        case 1: _t->setTextFormat(*reinterpret_cast< Qt::TextFormat*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}